

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmake_query.cpp
# Opt level: O1

string * __thiscall
cmakels::cmake_query::cmake_query::evaluate_variable
          (string *__return_storage_ptr__,cmake_query *this,string *name,string *uri)

{
  cmMakefile *this_00;
  char *__s;
  size_t sVar1;
  char *pcVar2;
  
  this_00 = get_makefile(this,uri);
  if (this_00 == (cmMakefile *)0x0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __s = "<variable-not-found>";
    pcVar2 = "";
  }
  else {
    __s = cmMakefile::GetDefinition(this_00,name);
    if (__s == (char *)0x0) {
      std::operator+(__return_storage_ptr__,"tried file",
                     (this_00->ListFiles).
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start);
      return __return_storage_ptr__;
    }
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    sVar1 = strlen(__s);
    pcVar2 = __s + sVar1;
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,__s,pcVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string cmake_query::evaluate_variable(std::string const &name,
                                           std::string const &uri) {
  auto mf = get_makefile(uri);
  if (mf) {
    auto var = mf->GetDefinition(name);
    return var ? var : "tried file" + mf->GetListFiles()[0];
  }
  return "<variable-not-found>";
}